

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::MatchChar3Inst::Exec
          (MatchChar3Inst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  MatchChar3Inst *this_local;
  
  Matcher::CompStats(matcher);
  if ((*inputOffset < inputLength) &&
     (((input[*inputOffset] == (this->super_Char3Mixin).cs[0] ||
       (input[*inputOffset] == (this->super_Char3Mixin).cs[1])) ||
      (input[*inputOffset] == (this->super_Char3Mixin).cs[2])))) {
    *inputOffset = *inputOffset + 1;
    *instPointer = *instPointer + 7;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  return this_local._7_1_;
}

Assistant:

inline bool MatchChar3Inst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset >= inputLength || (input[inputOffset] != cs[0] && input[inputOffset] != cs[1] && input[inputOffset] != cs[2]))
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        inputOffset++;
        instPointer += sizeof(*this);
        return false;
    }